

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

void PrintGraph(ExpressionGraphContext *ctx,ExprBase *expression,InplaceStr name)

{
  InplaceStr *pIVar1;
  uint uVar2;
  ExprBase *pEVar3;
  bool bVar4;
  uint uVar5;
  ExprBase **ppEVar6;
  ExprUnaryOp *pEVar7;
  ExprBinaryOp *pEVar8;
  char *pcVar9;
  undefined8 in_stack_fffffffffffff6f8;
  undefined8 in_stack_fffffffffffff700;
  char *pcVar10;
  undefined4 uVar11;
  char *in_stack_fffffffffffff708;
  undefined4 uVar12;
  char *local_808;
  char *local_7f0;
  ExprBase *local_7c8;
  ExprBase *value_11;
  ExprBase *local_7b0;
  ExprBase *value_10;
  uint local_794;
  undefined1 auStack_790 [4];
  uint i_2;
  ExpressionGraphContext *local_780;
  char *local_778;
  ExprModule *local_770;
  ExprModule *node_53;
  ExpressionGraphContext *pEStack_760;
  uint i_1;
  char *local_758;
  ExprSequence *local_750;
  ExprSequence *node_52;
  ExprBase *value_9;
  char *local_738;
  ExprBlock *local_730;
  ExprBlock *node_51;
  char *local_720;
  ExprContinue *local_718;
  ExprContinue *node_50;
  char *local_708;
  ExprBreak *local_700;
  ExprBreak *node_49;
  ExprBase *value_8;
  ExprBase *local_6e0;
  ExprBase *value_7;
  ExpressionGraphContext *local_6c8;
  char *local_6c0;
  ExprSwitch *local_6b8;
  ExprSwitch *node_48;
  char *local_6a8;
  ExprDoWhile *local_6a0;
  ExprDoWhile *node_47;
  char *local_690;
  ExprWhile *local_688;
  ExprWhile *node_46;
  char *local_678;
  ExprFor *local_670;
  ExprFor *node_45;
  char *local_660;
  ExprIfElse *local_658;
  ExprIfElse *node_44;
  char *local_648;
  ConstantData *local_640;
  ConstantData *value_6;
  ExpressionGraphContext *local_628;
  char *local_620;
  ExprEnumDefinition *local_618;
  ExprEnumDefinition *node_43;
  char *local_608;
  ConstantData *local_600;
  ConstantData *value_5;
  ExprBase *local_5e8;
  ExprBase *value_4;
  InplaceStr local_5d0;
  MemberHandle *local_5c0;
  MemberHandle *value_3;
  ExpressionGraphContext *local_5a8;
  char *local_5a0;
  ExpressionGraphContext *local_598;
  char *local_590;
  ExprClassDefinition *local_588;
  ExprClassDefinition *node_42;
  ExprBase *value_2;
  ExpressionGraphContext *local_568;
  char *local_560;
  ExprGenericClassPrototype *local_558;
  ExprGenericClassPrototype *node_41;
  char *local_548;
  ExprClassPrototype *local_540;
  ExprClassPrototype *node_40;
  char *local_530;
  ExprAliasDefinition *local_528;
  ExprAliasDefinition *node_39;
  ExprBase *arg_3;
  ExpressionGraphContext *local_508;
  char *local_500;
  ExprFunctionCall *local_4f8;
  ExprFunctionCall *node_38;
  char *local_4e8;
  ShortFunctionHandle *local_4e0;
  ShortFunctionHandle *arg_2;
  ExpressionGraphContext *local_4c8;
  char *local_4c0;
  ExprShortFunctionOverloadSet *local_4b8;
  ExprShortFunctionOverloadSet *node_37;
  char *local_4a8;
  FunctionHandle *local_4a0;
  FunctionHandle *arg_1;
  ExpressionGraphContext *local_488;
  char *local_480;
  ExprFunctionOverloadSet *local_478;
  ExprFunctionOverloadSet *node_36;
  char *local_468;
  ExprFunctionAccess *local_460;
  ExprFunctionAccess *node_35;
  ExprBase *expr_1;
  ExpressionGraphContext *local_440;
  char *local_438;
  ExprGenericFunctionPrototype *local_430;
  ExprGenericFunctionPrototype *node_34;
  ExprBase *expr;
  ExprVariableDefinition *local_410;
  ExprBase *arg;
  ExpressionGraphContext *local_3f8;
  char *local_3f0;
  InplaceStr local_3e8;
  FunctionData *local_3d8;
  FunctionData *implementation;
  char *local_3c8;
  ExpressionGraphContext *local_3c0;
  char *local_3b8;
  ExprFunctionDefinition *local_3b0;
  ExprFunctionDefinition *node_33;
  char *local_3a0;
  ExprFunctionContextAccess *local_398;
  ExprFunctionContextAccess *node_32;
  char *local_388;
  ExprVariableAccess *local_380;
  ExprVariableAccess *node_31;
  ExprBase *value_1;
  char *local_368;
  ExprVariableDefinitions *local_360;
  ExprVariableDefinitions *node_30;
  char *local_350;
  ExprArraySetup *local_348;
  ExprArraySetup *node_29;
  char *local_338;
  ExprZeroInitialize *local_330;
  ExprZeroInitialize *node_28;
  char *local_320;
  ExprVariableDefinition *local_318;
  ExprVariableDefinition *node_27;
  char *local_308;
  ExprYield *local_300;
  ExprYield *node_26;
  char *local_2f0;
  ExprReturn *local_2e8;
  ExprReturn *node_25;
  char *local_2d8;
  ExprArrayIndex *local_2d0;
  ExprArrayIndex *node_24;
  char *local_2c0;
  ExpressionGraphContext *local_2b8;
  char *local_2b0;
  ExprMemberAccess *local_2a8;
  ExprMemberAccess *node_23;
  char *local_298;
  ExprAssignment *local_290;
  ExprAssignment *node_22;
  char *local_280;
  ExprConditional *local_278;
  ExprConditional *node_21;
  char *local_268;
  ExprUnboxing *local_260;
  ExprUnboxing *node_20;
  char *local_250;
  ExprDereference *local_248;
  ExprDereference *node_19;
  char *local_238;
  ExprGetAddress *local_230;
  ExprGetAddress *node_18;
  char *local_220;
  ExprBinaryOp *local_218;
  ExprBinaryOp *node_17;
  char *local_208;
  ExprUnaryOp *local_200;
  ExprUnaryOp *node_16;
  char *local_1f0;
  char *local_1e8;
  char *category;
  ExprTypeCast *node_15;
  char *local_1d0;
  ExprPostModify *local_1c8;
  ExprPostModify *node_14;
  char *local_1b8;
  ExprPreModify *local_1b0;
  ExprPreModify *node_13;
  ExprBase *value;
  char *local_198;
  ExprArray *local_190;
  ExprArray *node_12;
  char *local_180;
  ExprPassthrough *local_178;
  ExprPassthrough *node_11;
  char *local_168;
  ExprFunctionIndexLiteral *local_160;
  ExprFunctionIndexLiteral *node_10;
  char *local_150;
  ExprNullptrLiteral *local_148;
  ExprNullptrLiteral *node_9;
  char *local_138;
  ExprTypeLiteral *local_130;
  ExprTypeLiteral *node_8;
  char *local_120;
  ExprRationalLiteral *local_118;
  ExprRationalLiteral *node_7;
  char *local_108;
  ExprIntegerLiteral *local_100;
  ExprIntegerLiteral *node_6;
  char *local_f0;
  ExprStringLiteral *local_e8;
  ExprStringLiteral *node_5;
  char *local_d8;
  ExpressionGraphContext *local_d0;
  char *local_c8;
  ExprCharacterLiteral *local_c0;
  ExprCharacterLiteral *node_4;
  char *local_b0;
  ExprBoolLiteral *local_a8;
  ExprBoolLiteral *node_3;
  char *local_98;
  ExprVoid *local_90;
  ExprVoid *node_2;
  char *local_80;
  ExprErrorTypeMemberAccess *local_78;
  ExprErrorTypeMemberAccess *node_1;
  char *local_68;
  uint local_5c;
  ExpressionGraphContext *pEStack_58;
  uint i;
  char *local_50;
  ExprError *local_48;
  ExprError *node;
  char *local_38;
  ExprBase *local_30;
  ExprBase *expression_local;
  ExpressionGraphContext *ctx_local;
  InplaceStr name_local;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
  local_38 = name.end;
  node = (ExprError *)name.begin;
  local_30 = expression;
  expression_local = (ExprBase *)ctx;
  ctx_local = (ExpressionGraphContext *)node;
  name_local.begin = local_38;
  if (ctx->depth < 0x401) {
    local_48 = getType<ExprError>(expression);
    if (local_48 == (ExprError *)0x0) {
      local_78 = getType<ExprErrorTypeMemberAccess>(local_30);
      if (local_78 == (ExprErrorTypeMemberAccess *)0x0) {
        local_90 = getType<ExprVoid>(local_30);
        if (local_90 == (ExprVoid *)0x0) {
          local_a8 = getType<ExprBoolLiteral>(local_30);
          if (local_a8 == (ExprBoolLiteral *)0x0) {
            local_c0 = getType<ExprCharacterLiteral>(local_30);
            if (local_c0 == (ExprCharacterLiteral *)0x0) {
              local_e8 = getType<ExprStringLiteral>(local_30);
              if (local_e8 == (ExprStringLiteral *)0x0) {
                local_100 = getType<ExprIntegerLiteral>(local_30);
                if (local_100 == (ExprIntegerLiteral *)0x0) {
                  local_118 = getType<ExprRationalLiteral>(local_30);
                  if (local_118 == (ExprRationalLiteral *)0x0) {
                    local_130 = getType<ExprTypeLiteral>(local_30);
                    if (local_130 == (ExprTypeLiteral *)0x0) {
                      local_148 = getType<ExprNullptrLiteral>(local_30);
                      if (local_148 == (ExprNullptrLiteral *)0x0) {
                        local_160 = getType<ExprFunctionIndexLiteral>(local_30);
                        if (local_160 == (ExprFunctionIndexLiteral *)0x0) {
                          local_178 = getType<ExprPassthrough>(local_30);
                          if (local_178 == (ExprPassthrough *)0x0) {
                            local_190 = getType<ExprArray>(local_30);
                            if (local_190 == (ExprArray *)0x0) {
                              local_1b0 = getType<ExprPreModify>(local_30);
                              if (local_1b0 == (ExprPreModify *)0x0) {
                                local_1c8 = getType<ExprPostModify>(local_30);
                                if (local_1c8 == (ExprPostModify *)0x0) {
                                  category = (char *)getType<ExprTypeCast>(local_30);
                                  if ((ExprTypeCast *)category == (ExprTypeCast *)0x0) {
                                    pEVar7 = getType<ExprUnaryOp>(local_30);
                                    pEVar3 = expression_local;
                                    local_200 = pEVar7;
                                    if (pEVar7 == (ExprUnaryOp *)0x0) {
                                      pEVar8 = getType<ExprBinaryOp>(local_30);
                                      pEVar3 = expression_local;
                                      local_218 = pEVar8;
                                      if (pEVar8 == (ExprBinaryOp *)0x0) {
                                        local_230 = getType<ExprGetAddress>(local_30);
                                        if (local_230 == (ExprGetAddress *)0x0) {
                                          local_248 = getType<ExprDereference>(local_30);
                                          if (local_248 == (ExprDereference *)0x0) {
                                            local_260 = getType<ExprUnboxing>(local_30);
                                            if (local_260 == (ExprUnboxing *)0x0) {
                                              local_278 = getType<ExprConditional>(local_30);
                                              if (local_278 == (ExprConditional *)0x0) {
                                                local_290 = getType<ExprAssignment>(local_30);
                                                if (local_290 == (ExprAssignment *)0x0) {
                                                  local_2a8 = getType<ExprMemberAccess>(local_30);
                                                  if (local_2a8 == (ExprMemberAccess *)0x0) {
                                                    local_2d0 = getType<ExprArrayIndex>(local_30);
                                                    if (local_2d0 == (ExprArrayIndex *)0x0) {
                                                      local_2e8 = getType<ExprReturn>(local_30);
                                                      if (local_2e8 == (ExprReturn *)0x0) {
                                                        local_300 = getType<ExprYield>(local_30);
                                                        if (local_300 == (ExprYield *)0x0) {
                                                          local_318 = 
                                                  getType<ExprVariableDefinition>(local_30);
                                                  if (local_318 == (ExprVariableDefinition *)0x0) {
                                                    local_330 = getType<ExprZeroInitialize>
                                                                          (local_30);
                                                    if (local_330 == (ExprZeroInitialize *)0x0) {
                                                      local_348 = getType<ExprArraySetup>(local_30);
                                                      if (local_348 == (ExprArraySetup *)0x0) {
                                                        local_360 = getType<ExprVariableDefinitions>
                                                                              (local_30);
                                                        if (local_360 ==
                                                            (ExprVariableDefinitions *)0x0) {
                                                          local_380 = getType<ExprVariableAccess>
                                                                                (local_30);
                                                          if (local_380 == (ExprVariableAccess *)0x0
                                                             ) {
                                                            local_398 = 
                                                  getType<ExprFunctionContextAccess>(local_30);
                                                  if (local_398 == (ExprFunctionContextAccess *)0x0)
                                                  {
                                                    local_3b0 = getType<ExprFunctionDefinition>
                                                                          (local_30);
                                                    if (local_3b0 == (ExprFunctionDefinition *)0x0)
                                                    {
                                                      local_430 = 
                                                  getType<ExprGenericFunctionPrototype>(local_30);
                                                  if (local_430 ==
                                                      (ExprGenericFunctionPrototype *)0x0) {
                                                    local_460 = getType<ExprFunctionAccess>
                                                                          (local_30);
                                                    if (local_460 == (ExprFunctionAccess *)0x0) {
                                                      local_478 = getType<ExprFunctionOverloadSet>
                                                                            (local_30);
                                                      if (local_478 ==
                                                          (ExprFunctionOverloadSet *)0x0) {
                                                        local_4b8 = 
                                                  getType<ExprShortFunctionOverloadSet>(local_30);
                                                  uVar11 = (undefined4)
                                                           ((ulong)in_stack_fffffffffffff700 >> 0x20
                                                           );
                                                  if (local_4b8 ==
                                                      (ExprShortFunctionOverloadSet *)0x0) {
                                                    local_4f8 = getType<ExprFunctionCall>(local_30);
                                                    if (local_4f8 == (ExprFunctionCall *)0x0) {
                                                      local_528 = getType<ExprAliasDefinition>
                                                                            (local_30);
                                                      if (local_528 == (ExprAliasDefinition *)0x0) {
                                                        local_540 = getType<ExprClassPrototype>
                                                                              (local_30);
                                                        if (local_540 == (ExprClassPrototype *)0x0)
                                                        {
                                                          local_558 = 
                                                  getType<ExprGenericClassPrototype>(local_30);
                                                  if (local_558 == (ExprGenericClassPrototype *)0x0)
                                                  {
                                                    local_588 = getType<ExprClassDefinition>
                                                                          (local_30);
                                                    if (local_588 == (ExprClassDefinition *)0x0) {
                                                      local_618 = getType<ExprEnumDefinition>
                                                                            (local_30);
                                                      if (local_618 == (ExprEnumDefinition *)0x0) {
                                                        local_658 = getType<ExprIfElse>(local_30);
                                                        if (local_658 == (ExprIfElse *)0x0) {
                                                          local_670 = getType<ExprFor>(local_30);
                                                          if (local_670 == (ExprFor *)0x0) {
                                                            local_688 = getType<ExprWhile>(local_30)
                                                            ;
                                                            if (local_688 == (ExprWhile *)0x0) {
                                                              local_6a0 = getType<ExprDoWhile>
                                                                                    (local_30);
                                                              if (local_6a0 == (ExprDoWhile *)0x0) {
                                                                local_6b8 = getType<ExprSwitch>(
                                                  local_30);
                                                  if (local_6b8 == (ExprSwitch *)0x0) {
                                                    local_700 = getType<ExprBreak>(local_30);
                                                    if (local_700 == (ExprBreak *)0x0) {
                                                      local_718 = getType<ExprContinue>(local_30);
                                                      if (local_718 == (ExprContinue *)0x0) {
                                                        local_730 = getType<ExprBlock>(local_30);
                                                        if (local_730 == (ExprBlock *)0x0) {
                                                          local_750 = getType<ExprSequence>
                                                                                (local_30);
                                                          if (local_750 == (ExprSequence *)0x0) {
                                                            local_770 = getType<ExprModule>(local_30
                                                  );
                                                  if (local_770 == (ExprModule *)0x0) {
                                                    if (local_30 != (ExprBase *)0x0) {
                                                      __assert_fail("!\"unknown type\"",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionGraph.cpp"
                                                  ,0x3de,
                                                  "void PrintGraph(ExpressionGraphContext &, ExprBase *, InplaceStr)"
                                                  );
                                                  }
                                                  PrintIndent((ExpressionGraphContext *)
                                                              expression_local);
                                                  OutputContext::Print
                                                            (*(OutputContext **)
                                                              &expression_local->typeID,
                                                             (char *)ctx_local,
                                                             (int)name_local.begin - (int)ctx_local)
                                                  ;
                                                  OutputContext::Print
                                                            (*(OutputContext **)
                                                              &expression_local->typeID,": null\n");
                                                  }
                                                  else {
                                                    local_780 = ctx_local;
                                                    local_778 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_770,
                                                                    (ExprBase *)"ExprModule()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    if (((ulong)expression_local->source &
                                                        0x100000000) == 0) {
                                                      PrintGraph((ExpressionGraphContext *)
                                                                 expression_local,
                                                                 local_770->moduleScope,true);
                                                    }
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               local_770->moduleScope,false);
                                                    pEVar3 = expression_local;
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)auStack_790,
                                                               "definitions");
                                                    PrintEnterBlock((ExpressionGraphContext *)pEVar3
                                                                    ,_auStack_790,(TypeBase *)0x0);
                                                    for (local_794 = 0; uVar2 = local_794,
                                                        uVar5 = SmallArray<ExprBase_*,_32U>::size
                                                                          (&local_770->definitions),
                                                        pEVar3 = expression_local, uVar2 < uVar5;
                                                        local_794 = local_794 + 1) {
                                                      ppEVar6 = SmallArray<ExprBase_*,_32U>::
                                                                operator[](&local_770->definitions,
                                                                           local_794);
                                                      PrintGraph((ExpressionGraphContext *)pEVar3,
                                                                 *ppEVar6,"");
                                                    }
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                    pEVar3 = expression_local;
                                                    *(undefined1 *)
                                                     ((long)&expression_local->source + 5) = 1;
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&value_10,"setup");
                                                    PrintEnterBlock((ExpressionGraphContext *)pEVar3
                                                                    ,_value_10,(TypeBase *)0x0);
                                                    for (local_7b0 = (local_770->setup).head;
                                                        local_7b0 != (ExprBase *)0x0;
                                                        local_7b0 = local_7b0->next) {
                                                      PrintGraph((ExpressionGraphContext *)
                                                                 expression_local,local_7b0,"");
                                                    }
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                    pEVar3 = expression_local;
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&value_11,"expressions"
                                                              );
                                                    PrintEnterBlock((ExpressionGraphContext *)pEVar3
                                                                    ,_value_11,(TypeBase *)0x0);
                                                    for (local_7c8 = (local_770->expressions).head;
                                                        local_7c8 != (ExprBase *)0x0;
                                                        local_7c8 = local_7c8->next) {
                                                      PrintGraph((ExpressionGraphContext *)
                                                                 expression_local,local_7c8,"");
                                                    }
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    pEStack_760 = ctx_local;
                                                    local_758 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_750,
                                                                    (ExprBase *)"ExprSequence()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    for (node_53._4_4_ = 0; uVar2 = node_53._4_4_,
                                                        uVar5 = SmallArray<ExprBase_*,_4U>::size
                                                                          (&local_750->expressions),
                                                        pEVar3 = expression_local, uVar2 < uVar5;
                                                        node_53._4_4_ = node_53._4_4_ + 1) {
                                                      ppEVar6 = SmallArray<ExprBase_*,_4U>::
                                                                operator[](&local_750->expressions,
                                                                           node_53._4_4_);
                                                      PrintGraph((ExpressionGraphContext *)pEVar3,
                                                                 *ppEVar6,"");
                                                    }
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    value_9 = (ExprBase *)ctx_local;
                                                    local_738 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_730,
                                                                    (ExprBase *)"ExprBlock()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    for (node_52 = (ExprSequence *)
                                                                   (local_730->expressions).head;
                                                        node_52 != (ExprSequence *)0x0;
                                                        node_52 = (ExprSequence *)
                                                                  (node_52->super_ExprBase).next) {
                                                      PrintGraph((ExpressionGraphContext *)
                                                                 expression_local,
                                                                 &node_52->super_ExprBase,"");
                                                    }
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_730->closures,
                                                               "closures");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_51 = (ExprBlock *)ctx_local;
                                                    local_720 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_718,
                                                                    (ExprBase *)"ExprContinue(%d)",
                                                                    (char *)ctx_local,
                                                                    name_local.begin,
                                                                    (ulong)*(uint *)&(local_718->
                                                                                     super_ExprBase)
                                                                                     .field_0x2c);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_718->closures,
                                                               "closures");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_50 = (ExprContinue *)ctx_local;
                                                    local_708 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_700,
                                                                    (ExprBase *)"ExprBreak(%d)",
                                                                    (char *)ctx_local,
                                                                    name_local.begin,
                                                                    (ulong)*(uint *)&(local_700->
                                                                                     super_ExprBase)
                                                                                     .field_0x2c);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_700->closures,
                                                               "closures");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    local_6c8 = ctx_local;
                                                    local_6c0 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_6b8,
                                                                    (ExprBase *)"ExprSwitch()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_6b8->condition
                                                               ,"condition");
                                                    pEVar3 = expression_local;
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&value_7,"cases");
                                                    PrintEnterBlock((ExpressionGraphContext *)pEVar3
                                                                    ,_value_7,(TypeBase *)0x0);
                                                    for (local_6e0 = (local_6b8->cases).head;
                                                        local_6e0 != (ExprBase *)0x0;
                                                        local_6e0 = local_6e0->next) {
                                                      PrintGraph((ExpressionGraphContext *)
                                                                 expression_local,local_6e0,"");
                                                    }
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                    pEVar3 = expression_local;
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&value_8,"blocks");
                                                    PrintEnterBlock((ExpressionGraphContext *)pEVar3
                                                                    ,_value_8,(TypeBase *)0x0);
                                                    for (node_49 = (ExprBreak *)
                                                                   (local_6b8->blocks).head;
                                                        node_49 != (ExprBreak *)0x0;
                                                        node_49 = (ExprBreak *)
                                                                  (node_49->super_ExprBase).next) {
                                                      PrintGraph((ExpressionGraphContext *)
                                                                 expression_local,
                                                                 &node_49->super_ExprBase,"");
                                                    }
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               local_6b8->defaultBlock,
                                                               "defaultBlock");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_48 = (ExprSwitch *)ctx_local;
                                                    local_6a8 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_6a0,
                                                                    (ExprBase *)"ExprDoWhile()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_6a0->body,
                                                               "body");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_6a0->condition
                                                               ,"condition");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_47 = (ExprDoWhile *)ctx_local;
                                                    local_690 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_688,
                                                                    (ExprBase *)"ExprWhile()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_688->condition
                                                               ,"condition");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_688->body,
                                                               "body");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_46 = (ExprWhile *)ctx_local;
                                                    local_678 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_670,
                                                                    (ExprBase *)"ExprFor()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               local_670->initializer,"initializer")
                                                    ;
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_670->condition
                                                               ,"condition");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_670->increment
                                                               ,"increment");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_670->body,
                                                               "body");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_45 = (ExprFor *)ctx_local;
                                                    local_660 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_658,
                                                                    (ExprBase *)"ExprIfElse()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_658->condition
                                                               ,"condition");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_658->trueBlock
                                                               ,"trueBlock");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               local_658->falseBlock,"falseBlock");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    local_628 = ctx_local;
                                                    local_620 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_618,
                                                                    (ExprBase *)
                                                                    "ExprEnumDefinition(%.*s)",
                                                                    (char *)ctx_local,
                                                                    name_local.begin,
                                                                    (ulong)(uint)((int)(local_618->
                                                                                        enumType->
                                                                                                                                                                              
                                                  super_TypeStruct).super_TypeBase.name.end -
                                                  (int)(local_618->enumType->super_TypeStruct).
                                                       super_TypeBase.name.begin),
                                                  (local_618->enumType->super_TypeStruct).
                                                  super_TypeBase.name.begin);
                                                  pEVar3 = expression_local;
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&value_6,"constants");
                                                  PrintEnterBlock((ExpressionGraphContext *)pEVar3,
                                                                  _value_6,(TypeBase *)0x0);
                                                  for (local_640 = (local_618->enumType->
                                                                   super_TypeStruct).constants.head;
                                                      local_640 != (ConstantData *)0x0;
                                                      local_640 = local_640->next) {
                                                    pIVar1 = &local_640->name->name;
                                                    node_44 = (ExprIfElse *)pIVar1->begin;
                                                    local_648 = (local_640->name->name).end;
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_640->value,
                                                               *pIVar1);
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_618->toInt,
                                                             "toInt");
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_618->toEnum,
                                                             "toEnum");
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    if (local_588->classType->baseClass ==
                                                        (TypeClass *)0x0) {
                                                      local_5a8 = ctx_local;
                                                      local_5a0 = name_local.begin;
                                                      pcVar9 = "\t";
                                                      if ((local_588->classType->extendable & 1U) !=
                                                          0) {
                                                        pcVar9 = ", extendable";
                                                      }
                                                      pcVar9 = pcVar9 + 1;
                                                      PrintEnterBlock((ExpressionGraphContext *)
                                                                      expression_local,local_588,
                                                                      (ExprBase *)
                                                                      "ExprClassDefinition(%.*s%s)",
                                                                      (char *)ctx_local,
                                                                      name_local.begin,
                                                                      (ulong)(uint)((int)(local_588
                                                  ->classType->super_TypeStruct).super_TypeBase.name
                                                  .end - (int)(local_588->classType->
                                                              super_TypeStruct).super_TypeBase.name.
                                                              begin),
                                                  (local_588->classType->super_TypeStruct).
                                                  super_TypeBase.name.begin,pcVar9);
                                                  }
                                                  else {
                                                    local_598 = ctx_local;
                                                    local_590 = name_local.begin;
                                                    in_stack_fffffffffffff708 =
                                                         (local_588->classType->baseClass->
                                                         super_TypeStruct).super_TypeBase.name.begin
                                                    ;
                                                    pcVar9 = (char *)CONCAT44(uVar11,(int)(local_588
                                                  ->classType->baseClass->super_TypeStruct).
                                                  super_TypeBase.name.end -
                                                  (int)(local_588->classType->baseClass->
                                                       super_TypeStruct).super_TypeBase.name.begin);
                                                  PrintEnterBlock((ExpressionGraphContext *)
                                                                  expression_local,local_588,
                                                                  (ExprBase *)
                                                                  "ExprClassDefinition(%.*s: %.*s)",
                                                                  (char *)ctx_local,name_local.begin
                                                                  ,(ulong)(uint)((int)(local_588->
                                                                                       classType->
                                                                                                                                                                            
                                                  super_TypeStruct).super_TypeBase.name.end -
                                                  (int)(local_588->classType->super_TypeStruct).
                                                       super_TypeBase.name.begin),
                                                  (local_588->classType->super_TypeStruct).
                                                  super_TypeBase.name.begin,pcVar9,
                                                  in_stack_fffffffffffff708);
                                                  }
                                                  pEVar3 = expression_local;
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&value_3,"variables");
                                                  PrintEnterBlock((ExpressionGraphContext *)pEVar3,
                                                                  _value_3,(TypeBase *)0x0);
                                                  local_5c0 = (local_588->classType->
                                                              super_TypeStruct).members.head;
                                                  while( true ) {
                                                    pEVar3 = expression_local;
                                                    uVar12 = (undefined4)
                                                             ((ulong)in_stack_fffffffffffff708 >>
                                                             0x20);
                                                    uVar11 = (undefined4)((ulong)pcVar9 >> 0x20);
                                                    if (local_5c0 == (MemberHandle *)0x0) break;
                                                    InplaceStr::InplaceStr(&local_5d0);
                                                    pcVar9 = (char *)CONCAT44(uVar11,local_5c0->
                                                                                     variable->
                                                                                     uniqueId);
                                                    in_stack_fffffffffffff708 =
                                                         (char *)CONCAT44(uVar12,local_5c0->variable
                                                                                 ->offset);
                                                    PrintIndented((ExpressionGraphContext *)pEVar3,
                                                                  local_5c0->variable->type,
                                                                  (TypeBase *)"%.*s: v%04x @ 0x%x",
                                                                  local_5d0.begin,local_5d0.end,
                                                                  (ulong)(uint)((int)(local_5c0->
                                                                                      variable->name
                                                                                     ->name).end -
                                                                               (int)(local_5c0->
                                                                                     variable->name
                                                                                    ->name).begin),
                                                                  (local_5c0->variable->name->name).
                                                                  begin,pcVar9,
                                                                  in_stack_fffffffffffff708);
                                                    local_5c0 = local_5c0->next;
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  pEVar3 = expression_local;
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&value_4,"functions");
                                                  PrintEnterBlock((ExpressionGraphContext *)pEVar3,
                                                                  _value_4,(TypeBase *)0x0);
                                                  for (local_5e8 = (local_588->functions).head;
                                                      local_5e8 != (ExprBase *)0x0;
                                                      local_5e8 = local_5e8->next) {
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_5e8,"");
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  pEVar3 = expression_local;
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&value_5,"constants");
                                                  PrintEnterBlock((ExpressionGraphContext *)pEVar3,
                                                                  _value_5,(TypeBase *)0x0);
                                                  for (local_600 = (local_588->classType->
                                                                   super_TypeStruct).constants.head;
                                                      local_600 != (ConstantData *)0x0;
                                                      local_600 = local_600->next) {
                                                    pIVar1 = &local_600->name->name;
                                                    node_43 = (ExprEnumDefinition *)pIVar1->begin;
                                                    local_608 = (local_600->name->name).end;
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_600->value,
                                                               *pIVar1);
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    local_568 = ctx_local;
                                                    local_560 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_558,
                                                                    (ExprBase *)
                                                                                                                                        
                                                  "ExprGenericClassPrototype(%.*s)",
                                                  (char *)ctx_local,name_local.begin,
                                                  (ulong)(uint)((int)(local_558->genericProtoType->
                                                                     super_TypeBase).name.end -
                                                               (int)(local_558->genericProtoType->
                                                                    super_TypeBase).name.begin),
                                                  (local_558->genericProtoType->super_TypeBase).name
                                                  .begin);
                                                  pEVar3 = expression_local;
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&value_2,"instances");
                                                  PrintEnterBlock((ExpressionGraphContext *)pEVar3,
                                                                  _value_2,(TypeBase *)0x0);
                                                  for (node_42 = (ExprClassDefinition *)
                                                                 (local_558->genericProtoType->
                                                                 instances).head;
                                                      node_42 != (ExprClassDefinition *)0x0;
                                                      node_42 = (ExprClassDefinition *)
                                                                (node_42->super_ExprBase).next) {
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               &node_42->super_ExprBase,"");
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_41 = (ExprGenericClassPrototype *)ctx_local
                                                    ;
                                                    local_548 = name_local.begin;
                                                    PrintIndented((ExpressionGraphContext *)
                                                                  expression_local,local_540,
                                                                  (ExprBase *)
                                                                  "ExprClassPrototype(%.*s)",
                                                                  (char *)ctx_local,name_local.begin
                                                                  ,(ulong)(uint)((int)(local_540->
                                                                                       classType->
                                                                                                                                                                            
                                                  super_TypeStruct).super_TypeBase.name.end -
                                                  (int)(local_540->classType->super_TypeStruct).
                                                       super_TypeBase.name.begin),
                                                  (local_540->classType->super_TypeStruct).
                                                  super_TypeBase.name.begin);
                                                  }
                                                  }
                                                  else {
                                                    node_40 = (ExprClassPrototype *)ctx_local;
                                                    local_530 = name_local.begin;
                                                    PrintIndented((ExpressionGraphContext *)
                                                                  expression_local,local_528,
                                                                  (ExprBase *)
                                                                                                                                    
                                                  "ExprAliasDefinition(%.*s %.*s: a%04x)",
                                                  (char *)ctx_local,name_local.begin,
                                                  (ulong)(uint)((int)(local_528->alias->type->name).
                                                                     end -
                                                               (int)(local_528->alias->type->name).
                                                                    begin),
                                                  (local_528->alias->type->name).begin,
                                                  CONCAT44(uVar11,(int)(local_528->alias->name->name
                                                                       ).end -
                                                                  (int)(local_528->alias->name->name
                                                                       ).begin),
                                                  (local_528->alias->name->name).begin,
                                                  local_528->alias->uniqueId);
                                                  }
                                                  }
                                                  else {
                                                    local_508 = ctx_local;
                                                    local_500 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_4f8,
                                                                    (ExprBase *)"ExprFunctionCall()"
                                                                    ,(char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_4f8->function,
                                                               "function");
                                                    pEVar3 = expression_local;
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&arg_3,"arguments");
                                                    PrintEnterBlock((ExpressionGraphContext *)pEVar3
                                                                    ,_arg_3,(TypeBase *)0x0);
                                                    for (node_39 = (ExprAliasDefinition *)
                                                                   (local_4f8->arguments).head;
                                                        node_39 != (ExprAliasDefinition *)0x0;
                                                        node_39 = (ExprAliasDefinition *)
                                                                  (node_39->super_ExprBase).next) {
                                                      PrintGraph((ExpressionGraphContext *)
                                                                 expression_local,
                                                                 &node_39->super_ExprBase,"");
                                                    }
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    local_4c8 = ctx_local;
                                                    local_4c0 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_4b8,
                                                                    (ExprBase *)
                                                                    "ExprShortFunctionOverloadSet()"
                                                                    ,(char *)ctx_local,
                                                                    name_local.begin);
                                                    pEVar3 = expression_local;
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&arg_2,"functions");
                                                    PrintEnterBlock((ExpressionGraphContext *)pEVar3
                                                                    ,_arg_2,(TypeBase *)0x0);
                                                    for (local_4e0 = (local_4b8->functions).head;
                                                        local_4e0 != (ShortFunctionHandle *)0x0;
                                                        local_4e0 = local_4e0->next) {
                                                      node_38 = (ExprFunctionCall *)ctx_local;
                                                      local_4e8 = name_local.begin;
                                                      in_stack_fffffffffffff700 =
                                                           CONCAT44((int)((ulong)
                                                  in_stack_fffffffffffff700 >> 0x20),
                                                  local_4e0->function->uniqueId);
                                                  PrintIndented((ExpressionGraphContext *)
                                                                expression_local,
                                                                local_4e0->function->type,
                                                                (TypeBase *)"%.*s: f%04x",
                                                                (char *)ctx_local,name_local.begin,
                                                                (ulong)(uint)((int)(local_4e0->
                                                                                    function->name->
                                                                                   name).end -
                                                                             (int)(local_4e0->
                                                                                   function->name->
                                                                                  name).begin),
                                                                (local_4e0->function->name->name).
                                                                begin,in_stack_fffffffffffff700);
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_4e0->context,
                                                             "context");
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    local_488 = ctx_local;
                                                    local_480 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_478,
                                                                    (ExprBase *)
                                                                    "ExprFunctionOverloadSet()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    pEVar3 = expression_local;
                                                    InplaceStr::InplaceStr
                                                              ((InplaceStr *)&arg_1,"functions");
                                                    PrintEnterBlock((ExpressionGraphContext *)pEVar3
                                                                    ,_arg_1,(TypeBase *)0x0);
                                                    for (local_4a0 = (local_478->functions).head;
                                                        local_4a0 != (FunctionHandle *)0x0;
                                                        local_4a0 = local_4a0->next) {
                                                      node_37 = (ExprShortFunctionOverloadSet *)
                                                                ctx_local;
                                                      local_4a8 = name_local.begin;
                                                      in_stack_fffffffffffff700 =
                                                           CONCAT44((int)((ulong)
                                                  in_stack_fffffffffffff700 >> 0x20),
                                                  local_4a0->function->uniqueId);
                                                  PrintIndented((ExpressionGraphContext *)
                                                                expression_local,
                                                                local_4a0->function->type,
                                                                (TypeBase *)"%.*s: f%04x",
                                                                (char *)ctx_local,name_local.begin,
                                                                (ulong)(uint)((int)(local_4a0->
                                                                                    function->name->
                                                                                   name).end -
                                                                             (int)(local_4a0->
                                                                                   function->name->
                                                                                  name).begin),
                                                                (local_4a0->function->name->name).
                                                                begin,in_stack_fffffffffffff700);
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_478->context,
                                                             "context");
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_36 = (ExprFunctionOverloadSet *)ctx_local;
                                                    local_468 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_460,
                                                                    (ExprBase *)
                                                                                                                                        
                                                  "ExprFunctionAccess(%.*s: f%04x)",
                                                  (char *)ctx_local,name_local.begin,
                                                  (ulong)(uint)((int)(local_460->function->name->
                                                                     name).end -
                                                               (int)(local_460->function->name->name
                                                                    ).begin),
                                                  (local_460->function->name->name).begin,
                                                  CONCAT44((int)((ulong)in_stack_fffffffffffff700 >>
                                                                0x20),local_460->function->uniqueId)
                                                  );
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_460->context,
                                                             "context");
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    local_440 = ctx_local;
                                                    local_438 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_430,
                                                                    (ExprBase *)
                                                                                                                                        
                                                  "ExprGenericFunctionPrototype(%.*s: f%04x)",
                                                  (char *)ctx_local,name_local.begin,
                                                  (ulong)(uint)((int)(local_430->function->name->
                                                                     name).end -
                                                               (int)(local_430->function->name->name
                                                                    ).begin),
                                                  (local_430->function->name->name).begin,
                                                  CONCAT44((int)((ulong)in_stack_fffffffffffff700 >>
                                                                0x20),local_430->function->uniqueId)
                                                  );
                                                  pEVar3 = expression_local;
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&expr_1,
                                                             "contextVariables");
                                                  PrintEnterBlock((ExpressionGraphContext *)pEVar3,
                                                                  _expr_1,(TypeBase *)0x0);
                                                  for (node_35 = (ExprFunctionAccess *)
                                                                 (local_430->contextVariables).head;
                                                      node_35 != (ExprFunctionAccess *)0x0;
                                                      node_35 = (ExprFunctionAccess *)
                                                                (node_35->super_ExprBase).next) {
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               &node_35->super_ExprBase,"");
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    uVar12 = (undefined4)
                                                             ((ulong)in_stack_fffffffffffff708 >>
                                                             0x20);
                                                    if (((ulong)expression_local->source &
                                                        0x10000000000) == 0) {
                                                      if ((local_3b0->function->isPrototype & 1U) ==
                                                          0) {
                                                        *(undefined1 *)
                                                         ((long)&expression_local->source + 5) = 1;
                                                        local_3f8 = ctx_local;
                                                        local_3f0 = name_local.begin;
                                                        pcVar9 = "";
                                                        if ((local_3b0->function->isPrototype & 1U)
                                                            != 0) {
                                                          pcVar9 = "prototype, ";
                                                        }
                                                        PrintEnterBlock((ExpressionGraphContext *)
                                                                        expression_local,local_3b0,
                                                                        (ExprBase *)
                                                                                                                                                
                                                  "ExprFunctionDefinition(%s%.*s: f%04x)",
                                                  (char *)ctx_local,name_local.begin,pcVar9,
                                                  CONCAT44(uVar11,(int)(local_3b0->function->name->
                                                                       name).end -
                                                                  (int)(local_3b0->function->name->
                                                                       name).begin),
                                                  (local_3b0->function->name->name).begin,
                                                  CONCAT44(uVar12,local_3b0->function->uniqueId));
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,
                                                             &local_3b0->contextArgument->
                                                              super_ExprBase,"contextArgument");
                                                  pEVar3 = expression_local;
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&arg,"arguments");
                                                  PrintEnterBlock((ExpressionGraphContext *)pEVar3,
                                                                  _arg,(TypeBase *)0x0);
                                                  for (local_410 = (local_3b0->arguments).head;
                                                      local_410 != (ExprVariableDefinition *)0x0;
                                                      local_410 = (ExprVariableDefinition *)
                                                                  (local_410->super_ExprBase).next)
                                                  {
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               &local_410->super_ExprBase,"");
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,
                                                             local_3b0->coroutineStateRead,
                                                             "coroutineStateRead");
                                                  pEVar3 = expression_local;
                                                  InplaceStr::InplaceStr
                                                            ((InplaceStr *)&expr,"expressions");
                                                  PrintEnterBlock((ExpressionGraphContext *)pEVar3,
                                                                  _expr,(TypeBase *)0x0);
                                                  for (node_34 = (ExprGenericFunctionPrototype *)
                                                                 (local_3b0->expressions).head;
                                                      node_34 != (ExprGenericFunctionPrototype *)0x0
                                                      ; node_34 = (ExprGenericFunctionPrototype *)
                                                                  (node_34->super_ExprBase).next) {
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               &node_34->super_ExprBase,"");
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  *(undefined1 *)
                                                   ((long)&expression_local->source + 5) = 0;
                                                  }
                                                  else {
                                                    implementation = (FunctionData *)ctx_local;
                                                    local_3c8 = name_local.begin;
                                                    pcVar9 = "";
                                                    if ((local_3b0->function->isPrototype & 1U) != 0
                                                       ) {
                                                      pcVar9 = "prototype, ";
                                                    }
                                                    pcVar10 = (local_3b0->function->name->name).
                                                              begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_3b0,
                                                                    (ExprBase *)
                                                                                                                                        
                                                  "ExprFunctionDefinition(%s%.*s: f%04x)",
                                                  (char *)ctx_local,name_local.begin,pcVar9,
                                                  CONCAT44(uVar11,(int)(local_3b0->function->name->
                                                                       name).end -
                                                                  (int)(local_3b0->function->name->
                                                                       name).begin),pcVar10,
                                                  CONCAT44(uVar12,local_3b0->function->uniqueId));
                                                  pEVar3 = expression_local;
                                                  uVar11 = (undefined4)((ulong)pcVar10 >> 0x20);
                                                  local_3d8 = local_3b0->function->implementation;
                                                  if (local_3d8 != (FunctionData *)0x0) {
                                                    InplaceStr::InplaceStr
                                                              (&local_3e8,"implementation");
                                                    PrintIndented((ExpressionGraphContext *)pEVar3,
                                                                  local_3d8->type,
                                                                  (TypeBase *)"%.*s: f%04x",
                                                                  local_3e8.begin,local_3e8.end,
                                                                  (ulong)(uint)((int)(local_3d8->
                                                                                      name->name).
                                                                                     end -
                                                                               (int)(local_3d8->name
                                                                                    ->name).begin),
                                                                  (local_3d8->name->name).begin,
                                                                  CONCAT44(uVar11,local_3d8->
                                                                                  uniqueId));
                                                  }
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    local_3c0 = ctx_local;
                                                    local_3b8 = name_local.begin;
                                                    pcVar9 = "";
                                                    if ((local_3b0->function->isPrototype & 1U) != 0
                                                       ) {
                                                      pcVar9 = "prototype, ";
                                                    }
                                                    PrintIndented((ExpressionGraphContext *)
                                                                  expression_local,local_3b0,
                                                                  (ExprBase *)
                                                                                                                                    
                                                  "ExprFunctionDefinition(%s%.*s: f%04x);",
                                                  (char *)ctx_local,name_local.begin,pcVar9,
                                                  CONCAT44(uVar11,(int)(local_3b0->function->name->
                                                                       name).end -
                                                                  (int)(local_3b0->function->name->
                                                                       name).begin),
                                                  (local_3b0->function->name->name).begin,
                                                  CONCAT44(uVar12,local_3b0->function->uniqueId));
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    node_33 = (ExprFunctionDefinition *)ctx_local;
                                                    local_3a0 = name_local.begin;
                                                    PrintIndented((ExpressionGraphContext *)
                                                                  expression_local,local_398,
                                                                  (ExprBase *)
                                                                                                                                    
                                                  "ExprFunctionContextAccess(%.*s: f%04x)",
                                                  (char *)ctx_local,name_local.begin,
                                                  (ulong)(uint)((int)(local_398->function->name->
                                                                     name).end -
                                                               (int)(local_398->function->name->name
                                                                    ).begin),
                                                  (local_398->function->name->name).begin,
                                                  CONCAT44((int)((ulong)in_stack_fffffffffffff700 >>
                                                                0x20),local_398->function->uniqueId)
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    node_32 = (ExprFunctionContextAccess *)ctx_local
                                                    ;
                                                    local_388 = name_local.begin;
                                                    PrintIndented((ExpressionGraphContext *)
                                                                  expression_local,local_380,
                                                                  (ExprBase *)
                                                                  "ExprVariableAccess(%.*s: v%04x)",
                                                                  (char *)ctx_local,name_local.begin
                                                                  ,(ulong)(uint)((int)(local_380->
                                                                                       variable->
                                                                                       name->name).
                                                                                      end -
                                                                                (int)(local_380->
                                                                                      variable->name
                                                                                     ->name).begin),
                                                                  (local_380->variable->name->name).
                                                                  begin,CONCAT44((int)((ulong)
                                                  in_stack_fffffffffffff700 >> 0x20),
                                                  local_380->variable->uniqueId));
                                                  }
                                                  }
                                                  else {
                                                    value_1 = (ExprBase *)ctx_local;
                                                    local_368 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_360,
                                                                    (ExprBase *)
                                                                    "ExprVariableDefinitions()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    for (node_31 = (ExprVariableAccess *)
                                                                   (local_360->definitions).head;
                                                        node_31 != (ExprVariableAccess *)0x0;
                                                        node_31 = (ExprVariableAccess *)
                                                                  (node_31->super_ExprBase).next) {
                                                      PrintGraph((ExpressionGraphContext *)
                                                                 expression_local,
                                                                 &node_31->super_ExprBase,"");
                                                    }
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_30 = (ExprVariableDefinitions *)ctx_local;
                                                    local_350 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_348,
                                                                    (ExprBase *)"ExprArraySetup()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_348->lhs,"lhs"
                                                              );
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               local_348->initializer,"initializer")
                                                    ;
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_29 = (ExprArraySetup *)ctx_local;
                                                    local_338 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_330,
                                                                    (ExprBase *)
                                                                    "ExprZeroInitialize()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_330->address,
                                                               "address");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_28 = (ExprZeroInitialize *)ctx_local;
                                                    local_320 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_318,
                                                                    (ExprBase *)
                                                                                                                                        
                                                  "ExprVariableDefinition(%.*s %.*s: v%04x)",
                                                  (char *)ctx_local,name_local.begin,
                                                  (ulong)(uint)((int)(local_318->variable->variable
                                                                      ->type->name).end -
                                                               (int)(local_318->variable->variable->
                                                                     type->name).begin),
                                                  (local_318->variable->variable->type->name).begin,
                                                  CONCAT44((int)((ulong)in_stack_fffffffffffff700 >>
                                                                0x20),
                                                           (int)(local_318->variable->variable->name
                                                                ->name).end -
                                                           (int)(local_318->variable->variable->name
                                                                ->name).begin),
                                                  (local_318->variable->variable->name->name).begin,
                                                  local_318->variable->variable->uniqueId);
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_318->initializer
                                                             ,"initializer");
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_27 = (ExprVariableDefinition *)ctx_local;
                                                    local_308 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_300,
                                                                    (ExprBase *)"ExprYield()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_300->value,
                                                               "value");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               local_300->coroutineStateUpdate,
                                                               "coroutineStateUpdate");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_300->closures,
                                                               "closures");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_26 = (ExprYield *)ctx_local;
                                                    local_2f0 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_2e8,
                                                                    (ExprBase *)"ExprReturn()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_2e8->value,
                                                               "value");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,
                                                               local_2e8->coroutineStateUpdate,
                                                               "coroutineStateUpdate");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_2e8->closures,
                                                               "closures");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    node_25 = (ExprReturn *)ctx_local;
                                                    local_2d8 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_2d0,
                                                                    (ExprBase *)"ExprArrayIndex()",
                                                                    (char *)ctx_local,
                                                                    name_local.begin);
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_2d0->value,
                                                               "value");
                                                    PrintGraph((ExpressionGraphContext *)
                                                               expression_local,local_2d0->index,
                                                               "index");
                                                    PrintLeaveBlock((ExpressionGraphContext *)
                                                                    expression_local);
                                                  }
                                                  }
                                                  else {
                                                    if (local_2a8->member == (VariableHandle *)0x0)
                                                    {
                                                      node_24 = (ExprArrayIndex *)ctx_local;
                                                      local_2c0 = name_local.begin;
                                                      PrintEnterBlock((ExpressionGraphContext *)
                                                                      expression_local,local_2a8,
                                                                      (ExprBase *)
                                                                                                                                            
                                                  "ExprMemberAccess(%%missing%%)",(char *)ctx_local,
                                                  name_local.begin);
                                                  }
                                                  else {
                                                    local_2b8 = ctx_local;
                                                    local_2b0 = name_local.begin;
                                                    PrintEnterBlock((ExpressionGraphContext *)
                                                                    expression_local,local_2a8,
                                                                    (ExprBase *)
                                                                    "ExprMemberAccess(%.*s: v%04x)",
                                                                    (char *)ctx_local,
                                                                    name_local.begin,
                                                                    (ulong)(uint)((int)(local_2a8->
                                                                                        member->
                                                  variable->name->name).end -
                                                  (int)(local_2a8->member->variable->name->name).
                                                       begin),
                                                  (local_2a8->member->variable->name->name).begin,
                                                  CONCAT44((int)((ulong)in_stack_fffffffffffff700 >>
                                                                0x20),
                                                           local_2a8->member->variable->uniqueId));
                                                  }
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_2a8->value,
                                                             "value");
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                  }
                                                }
                                                else {
                                                  node_23 = (ExprMemberAccess *)ctx_local;
                                                  local_298 = name_local.begin;
                                                  PrintEnterBlock((ExpressionGraphContext *)
                                                                  expression_local,local_290,
                                                                  (ExprBase *)"ExprAssignment()",
                                                                  (char *)ctx_local,name_local.begin
                                                                 );
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_290->lhs,"lhs");
                                                  PrintGraph((ExpressionGraphContext *)
                                                             expression_local,local_290->rhs,"rhs");
                                                  PrintLeaveBlock((ExpressionGraphContext *)
                                                                  expression_local);
                                                }
                                              }
                                              else {
                                                node_22 = (ExprAssignment *)ctx_local;
                                                local_280 = name_local.begin;
                                                PrintEnterBlock((ExpressionGraphContext *)
                                                                expression_local,local_278,
                                                                (ExprBase *)"ExprConditional()",
                                                                (char *)ctx_local,name_local.begin);
                                                PrintGraph((ExpressionGraphContext *)
                                                           expression_local,local_278->condition,
                                                           "condition");
                                                PrintGraph((ExpressionGraphContext *)
                                                           expression_local,local_278->trueBlock,
                                                           "trueBlock");
                                                PrintGraph((ExpressionGraphContext *)
                                                           expression_local,local_278->falseBlock,
                                                           "falseBlock");
                                                PrintLeaveBlock((ExpressionGraphContext *)
                                                                expression_local);
                                              }
                                            }
                                            else {
                                              node_21 = (ExprConditional *)ctx_local;
                                              local_268 = name_local.begin;
                                              PrintEnterBlock((ExpressionGraphContext *)
                                                              expression_local,local_260,
                                                              (ExprBase *)"ExprUnboxing()",
                                                              (char *)ctx_local,name_local.begin);
                                              PrintGraph((ExpressionGraphContext *)expression_local,
                                                         local_260->value,"value");
                                              PrintLeaveBlock((ExpressionGraphContext *)
                                                              expression_local);
                                            }
                                          }
                                          else {
                                            node_20 = (ExprUnboxing *)ctx_local;
                                            local_250 = name_local.begin;
                                            PrintEnterBlock((ExpressionGraphContext *)
                                                            expression_local,local_248,
                                                            (ExprBase *)"ExprDereference()",
                                                            (char *)ctx_local,name_local.begin);
                                            PrintGraph((ExpressionGraphContext *)expression_local,
                                                       local_248->value,"value");
                                            PrintLeaveBlock((ExpressionGraphContext *)
                                                            expression_local);
                                          }
                                        }
                                        else {
                                          node_19 = (ExprDereference *)ctx_local;
                                          local_238 = name_local.begin;
                                          PrintIndented((ExpressionGraphContext *)expression_local,
                                                        local_230,
                                                        (ExprBase *)"ExprGetAddress(%.*s: v%04x)",
                                                        (char *)ctx_local,name_local.begin,
                                                        (ulong)(uint)((int)(local_230->variable->
                                                                            variable->name->name).
                                                                           end -
                                                                     (int)(local_230->variable->
                                                                           variable->name->name).
                                                                          begin),
                                                        (local_230->variable->variable->name->name).
                                                        begin,CONCAT44((int)((ulong)
                                                  in_stack_fffffffffffff700 >> 0x20),
                                                  local_230->variable->variable->uniqueId));
                                        }
                                      }
                                      else {
                                        node_18 = (ExprGetAddress *)ctx_local;
                                        local_220 = name_local.begin;
                                        pcVar9 = GetOpName(*(SynBinaryOpType *)
                                                            &(pEVar8->super_ExprBase).field_0x2c);
                                        PrintEnterBlock((ExpressionGraphContext *)pEVar3,pEVar8,
                                                        (ExprBase *)"ExprBinaryOp(%s)",
                                                        (char *)node_18,local_220,pcVar9);
                                        PrintGraph((ExpressionGraphContext *)expression_local,
                                                   local_218->lhs,"lhs");
                                        PrintGraph((ExpressionGraphContext *)expression_local,
                                                   local_218->rhs,"rhs");
                                        PrintLeaveBlock((ExpressionGraphContext *)expression_local);
                                      }
                                    }
                                    else {
                                      node_17 = (ExprBinaryOp *)ctx_local;
                                      local_208 = name_local.begin;
                                      pcVar9 = GetOpName(*(SynUnaryOpType *)
                                                          &(pEVar7->super_ExprBase).field_0x2c);
                                      PrintEnterBlock((ExpressionGraphContext *)pEVar3,pEVar7,
                                                      (ExprBase *)"ExprUnaryOp(%s)",(char *)node_17,
                                                      local_208,pcVar9);
                                      PrintGraph((ExpressionGraphContext *)expression_local,
                                                 local_200->value,"value");
                                      PrintLeaveBlock((ExpressionGraphContext *)expression_local);
                                    }
                                  }
                                  else {
                                    local_1e8 = "";
                                    switch(((ExprTypeCast *)category)->category) {
                                    case EXPR_CAST_NUMERICAL:
                                      local_1e8 = "EXPR_CAST_NUMERICAL";
                                      break;
                                    case EXPR_CAST_PTR_TO_BOOL:
                                      local_1e8 = "EXPR_CAST_PTR_TO_BOOL";
                                      break;
                                    case EXPR_CAST_UNSIZED_TO_BOOL:
                                      local_1e8 = "EXPR_CAST_UNSIZED_TO_BOOL";
                                      break;
                                    case EXPR_CAST_FUNCTION_TO_BOOL:
                                      local_1e8 = "EXPR_CAST_FUNCTION_TO_BOOL";
                                      break;
                                    case EXPR_CAST_NULL_TO_PTR:
                                      local_1e8 = "EXPR_CAST_NULL_TO_PTR";
                                      break;
                                    case EXPR_CAST_NULL_TO_AUTO_PTR:
                                      local_1e8 = "EXPR_CAST_NULL_TO_AUTO_PTR";
                                      break;
                                    case EXPR_CAST_NULL_TO_UNSIZED:
                                      local_1e8 = "EXPR_CAST_NULL_TO_UNSIZED";
                                      break;
                                    case EXPR_CAST_NULL_TO_AUTO_ARRAY:
                                      local_1e8 = "EXPR_CAST_NULL_TO_AUTO_ARRAY";
                                      break;
                                    case EXPR_CAST_NULL_TO_FUNCTION:
                                      local_1e8 = "EXPR_CAST_NULL_TO_FUNCTION";
                                      break;
                                    case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
                                      local_1e8 = "EXPR_CAST_ARRAY_PTR_TO_UNSIZED";
                                      break;
                                    case EXPR_CAST_PTR_TO_AUTO_PTR:
                                      local_1e8 = "EXPR_CAST_PTR_TO_AUTO_PTR";
                                      break;
                                    case EXPR_CAST_AUTO_PTR_TO_PTR:
                                      local_1e8 = "EXPR_CAST_AUTO_PTR_TO_PTR";
                                      break;
                                    case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
                                      local_1e8 = "EXPR_CAST_UNSIZED_TO_AUTO_ARRAY";
                                      break;
                                    case EXPR_CAST_REINTERPRET:
                                      local_1e8 = "EXPR_CAST_REINTERPRET";
                                      break;
                                    default:
                                      __assert_fail("!\"unknown category\"",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionGraph.cpp"
                                                  ,0x204,
                                                  "void PrintGraph(ExpressionGraphContext &, ExprBase *, InplaceStr)"
                                                  );
                                    }
                                    node_16 = (ExprUnaryOp *)ctx_local;
                                    local_1f0 = name_local.begin;
                                    PrintEnterBlock((ExpressionGraphContext *)expression_local,
                                                    category,(ExprBase *)"ExprTypeCast(%s)",
                                                    (char *)ctx_local,name_local.begin,local_1e8);
                                    PrintGraph((ExpressionGraphContext *)expression_local,
                                               *(ExprBase **)(category + 0x30),"value");
                                    PrintLeaveBlock((ExpressionGraphContext *)expression_local);
                                  }
                                }
                                else {
                                  node_15 = (ExprTypeCast *)ctx_local;
                                  local_1d0 = name_local.begin;
                                  if ((local_1c8->isIncrement & 1U) == 0) {
                                    local_808 = "))--";
                                  }
                                  else {
                                    local_808 = "))++";
                                  }
                                  local_808 = local_808 + 2;
                                  PrintEnterBlock((ExpressionGraphContext *)expression_local,
                                                  local_1c8,(ExprBase *)"ExprPostModify(%s)",
                                                  (char *)ctx_local,name_local.begin,local_808);
                                  PrintGraph((ExpressionGraphContext *)expression_local,
                                             local_1c8->value,"value");
                                  PrintLeaveBlock((ExpressionGraphContext *)expression_local);
                                }
                              }
                              else {
                                node_14 = (ExprPostModify *)ctx_local;
                                local_1b8 = name_local.begin;
                                if ((local_1b0->isIncrement & 1U) == 0) {
                                  local_7f0 = "))--";
                                }
                                else {
                                  local_7f0 = "))++";
                                }
                                local_7f0 = local_7f0 + 2;
                                PrintEnterBlock((ExpressionGraphContext *)expression_local,local_1b0
                                                ,(ExprBase *)"ExprPreModify(%s)",(char *)ctx_local,
                                                name_local.begin,local_7f0);
                                PrintGraph((ExpressionGraphContext *)expression_local,
                                           local_1b0->value,"value");
                                PrintLeaveBlock((ExpressionGraphContext *)expression_local);
                              }
                            }
                            else {
                              value = (ExprBase *)ctx_local;
                              local_198 = name_local.begin;
                              PrintEnterBlock((ExpressionGraphContext *)expression_local,local_190,
                                              (ExprBase *)"ExprArray()",(char *)ctx_local,
                                              name_local.begin);
                              for (node_13 = (ExprPreModify *)(local_190->values).head;
                                  node_13 != (ExprPreModify *)0x0;
                                  node_13 = (ExprPreModify *)(node_13->super_ExprBase).next) {
                                PrintGraph((ExpressionGraphContext *)expression_local,
                                           &node_13->super_ExprBase,"");
                              }
                              PrintLeaveBlock((ExpressionGraphContext *)expression_local);
                            }
                          }
                          else {
                            node_12 = (ExprArray *)ctx_local;
                            local_180 = name_local.begin;
                            PrintEnterBlock((ExpressionGraphContext *)expression_local,local_178,
                                            (ExprBase *)"ExprPassthrough()",(char *)ctx_local,
                                            name_local.begin);
                            PrintGraph((ExpressionGraphContext *)expression_local,local_178->value,
                                       "value");
                            PrintLeaveBlock((ExpressionGraphContext *)expression_local);
                          }
                        }
                        else {
                          node_11 = (ExprPassthrough *)ctx_local;
                          local_168 = name_local.begin;
                          PrintIndented((ExpressionGraphContext *)expression_local,local_160,
                                        (ExprBase *)"ExprFunctionIndexLiteral(%.*s: f%04x)",
                                        (char *)ctx_local,name_local.begin,
                                        (ulong)(uint)((int)(local_160->function->name->name).end -
                                                     (int)(local_160->function->name->name).begin),
                                        (local_160->function->name->name).begin,
                                        CONCAT44((int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                                                 local_160->function->uniqueId));
                        }
                      }
                      else {
                        node_10 = (ExprFunctionIndexLiteral *)ctx_local;
                        local_150 = name_local.begin;
                        PrintIndented((ExpressionGraphContext *)expression_local,local_148,
                                      (ExprBase *)"ExprNullptrLiteral()",(char *)ctx_local,
                                      name_local.begin);
                      }
                    }
                    else {
                      node_9 = (ExprNullptrLiteral *)ctx_local;
                      local_138 = name_local.begin;
                      PrintIndented((ExpressionGraphContext *)expression_local,local_130,
                                    (ExprBase *)"ExprTypeLiteral(%.*s)",(char *)ctx_local,
                                    name_local.begin,
                                    (ulong)(uint)((int)(local_130->value->name).end -
                                                 (int)(local_130->value->name).begin),
                                    (local_130->value->name).begin);
                    }
                  }
                  else {
                    node_8 = (ExprTypeLiteral *)ctx_local;
                    local_120 = name_local.begin;
                    PrintIndented((ExpressionGraphContext *)expression_local,local_118,
                                  (ExprBase *)"ExprRationalLiteral(%f)",(char *)local_118->value,
                                  ctx_local,name_local.begin);
                  }
                }
                else {
                  node_7 = (ExprRationalLiteral *)ctx_local;
                  local_108 = name_local.begin;
                  PrintIndented((ExpressionGraphContext *)expression_local,local_100,
                                (ExprBase *)"ExprIntegerLiteral(%lld)",(char *)ctx_local,
                                name_local.begin,local_100->value);
                }
              }
              else {
                node_6 = (ExprIntegerLiteral *)ctx_local;
                local_f0 = name_local.begin;
                PrintIndented((ExpressionGraphContext *)expression_local,local_e8,
                              (ExprBase *)"ExprStringLiteral(\'%.*s\')",(char *)ctx_local,
                              name_local.begin,(ulong)local_e8->length,local_e8->value);
              }
            }
            else if ((char)(local_c0->super_ExprBase).field_0x29 < ' ') {
              local_d0 = ctx_local;
              local_c8 = name_local.begin;
              PrintIndented((ExpressionGraphContext *)expression_local,local_c0,
                            (ExprBase *)"ExprCharacterLiteral(0x%02x)",(char *)ctx_local,
                            name_local.begin,
                            (ulong)(uint)(int)(char)(local_c0->super_ExprBase).field_0x29);
            }
            else {
              node_5 = (ExprStringLiteral *)ctx_local;
              local_d8 = name_local.begin;
              PrintIndented((ExpressionGraphContext *)expression_local,local_c0,
                            (ExprBase *)"ExprCharacterLiteral(\'%c\')",(char *)ctx_local,
                            name_local.begin,
                            (ulong)(uint)(int)(char)(local_c0->super_ExprBase).field_0x29);
            }
          }
          else {
            node_4 = (ExprCharacterLiteral *)ctx_local;
            local_b0 = name_local.begin;
            pcVar9 = "false";
            if (((local_a8->super_ExprBase).field_0x29 & 1) != 0) {
              pcVar9 = "true";
            }
            PrintIndented((ExpressionGraphContext *)expression_local,local_a8,
                          (ExprBase *)"ExprBoolLiteral(%s)",(char *)ctx_local,name_local.begin,
                          pcVar9);
          }
        }
        else {
          node_3 = (ExprBoolLiteral *)ctx_local;
          local_98 = name_local.begin;
          PrintIndented((ExpressionGraphContext *)expression_local,local_90,(ExprBase *)"ExprVoid()"
                        ,(char *)ctx_local,name_local.begin);
        }
      }
      else {
        node_2 = (ExprVoid *)ctx_local;
        local_80 = name_local.begin;
        PrintIndented((ExpressionGraphContext *)expression_local,local_78,
                      (ExprBase *)"ExprErrorTypeMemberAccess(%.*s)",(char *)ctx_local,
                      name_local.begin,
                      (ulong)(uint)((int)(local_78->value->name).end -
                                   (int)(local_78->value->name).begin),(local_78->value->name).begin
                     );
      }
    }
    else {
      bVar4 = SmallArray<ExprBase_*,_4U>::empty(&local_48->values);
      if (bVar4) {
        node_1 = (ExprErrorTypeMemberAccess *)ctx_local;
        local_68 = name_local.begin;
        PrintIndented((ExpressionGraphContext *)expression_local,local_48,(ExprBase *)"ExprError()",
                      (char *)ctx_local,name_local.begin);
      }
      else {
        pEStack_58 = ctx_local;
        local_50 = name_local.begin;
        PrintEnterBlock((ExpressionGraphContext *)expression_local,local_48,
                        (ExprBase *)"ExprError()",(char *)ctx_local,name_local.begin);
        for (local_5c = 0; uVar2 = local_5c,
            uVar5 = SmallArray<ExprBase_*,_4U>::size(&local_48->values), pEVar3 = expression_local,
            uVar2 < uVar5; local_5c = local_5c + 1) {
          ppEVar6 = SmallArray<ExprBase_*,_4U>::operator[](&local_48->values,local_5c);
          PrintGraph((ExpressionGraphContext *)pEVar3,*ppEVar6,"");
        }
        PrintLeaveBlock((ExpressionGraphContext *)expression_local);
      }
    }
  }
  else {
    PrintIndented(ctx,expression,(ExprBase *)"{...}",(char *)node,local_38);
  }
  return;
}

Assistant:

void PrintGraph(ExpressionGraphContext &ctx, ExprBase *expression, InplaceStr name)
{
	if(ctx.depth > 1024)
	{
		PrintIndented(ctx, name, expression, "{...}");
		return;
	}

	if(ExprError *node = getType<ExprError>(expression))
	{
		if(!node->values.empty())
		{
			PrintEnterBlock(ctx, name, node, "ExprError()");

			for(unsigned i = 0; i < node->values.size(); i++)
				PrintGraph(ctx, node->values[i], "");

			PrintLeaveBlock(ctx);
		}
		else
		{
			PrintIndented(ctx, name, node, "ExprError()");
		}
	}
	else if(ExprErrorTypeMemberAccess *node = getType<ExprErrorTypeMemberAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprErrorTypeMemberAccess(%.*s)", FMT_ISTR(node->value->name));
	}
	else if(ExprVoid *node = getType<ExprVoid>(expression))
	{
		PrintIndented(ctx, name, node, "ExprVoid()");
	}
	else if(ExprBoolLiteral *node = getType<ExprBoolLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprBoolLiteral(%s)", node->value ? "true" : "false");
	}
	else if(ExprCharacterLiteral *node = getType<ExprCharacterLiteral>(expression))
	{
		if((int)node->value < (int)' ')
			PrintIndented(ctx, name, node, "ExprCharacterLiteral(0x%02x)", node->value);
		else
			PrintIndented(ctx, name, node, "ExprCharacterLiteral(\'%c\')", node->value);
	}
	else if(ExprStringLiteral *node = getType<ExprStringLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprStringLiteral(\'%.*s\')", node->length, node->value);
	}
	else if(ExprIntegerLiteral *node = getType<ExprIntegerLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprIntegerLiteral(%lld)", node->value);
	}
	else if(ExprRationalLiteral *node = getType<ExprRationalLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprRationalLiteral(%f)", node->value);
	}
	else if(ExprTypeLiteral *node = getType<ExprTypeLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprTypeLiteral(%.*s)", FMT_ISTR(node->value->name));
	}
	else if(ExprNullptrLiteral *node = getType<ExprNullptrLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprNullptrLiteral()");
	}
	else if(ExprFunctionIndexLiteral *node = getType<ExprFunctionIndexLiteral>(expression))
	{
		PrintIndented(ctx, name, node, "ExprFunctionIndexLiteral(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);
	}
	else if(ExprPassthrough *node = getType<ExprPassthrough>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPassthrough()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArray *node = getType<ExprArray>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArray()");

		for(ExprBase *value = node->values.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprPreModify *node = getType<ExprPreModify>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPreModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprPostModify *node = getType<ExprPostModify>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprPostModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprTypeCast *node = getType<ExprTypeCast>(expression))
	{
		const char *category = "";

		switch(node->category)
		{
		case EXPR_CAST_NUMERICAL:
			category = "EXPR_CAST_NUMERICAL";
			break;
		case EXPR_CAST_PTR_TO_BOOL:
			category = "EXPR_CAST_PTR_TO_BOOL";
			break;
		case EXPR_CAST_UNSIZED_TO_BOOL:
			category = "EXPR_CAST_UNSIZED_TO_BOOL";
			break;
		case EXPR_CAST_FUNCTION_TO_BOOL:
			category = "EXPR_CAST_FUNCTION_TO_BOOL";
			break;
		case EXPR_CAST_NULL_TO_PTR:
			category = "EXPR_CAST_NULL_TO_PTR";
			break;
		case EXPR_CAST_NULL_TO_AUTO_PTR:
			category = "EXPR_CAST_NULL_TO_AUTO_PTR";
			break;
		case EXPR_CAST_NULL_TO_UNSIZED:
			category = "EXPR_CAST_NULL_TO_UNSIZED";
			break;
		case EXPR_CAST_NULL_TO_AUTO_ARRAY:
			category = "EXPR_CAST_NULL_TO_AUTO_ARRAY";
			break;
		case EXPR_CAST_NULL_TO_FUNCTION:
			category = "EXPR_CAST_NULL_TO_FUNCTION";
			break;
		case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
			category = "EXPR_CAST_ARRAY_PTR_TO_UNSIZED";
			break;
		case EXPR_CAST_PTR_TO_AUTO_PTR:
			category = "EXPR_CAST_PTR_TO_AUTO_PTR";
			break;
		case EXPR_CAST_AUTO_PTR_TO_PTR:
			category = "EXPR_CAST_AUTO_PTR_TO_PTR";
			break;
		case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
			category = "EXPR_CAST_UNSIZED_TO_AUTO_ARRAY";
			break;
		case EXPR_CAST_REINTERPRET:
			category = "EXPR_CAST_REINTERPRET";
			break;
		default:
			assert(!"unknown category");
		}

		PrintEnterBlock(ctx, name, node, "ExprTypeCast(%s)", category);

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprUnaryOp *node = getType<ExprUnaryOp>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprUnaryOp(%s)", GetOpName(node->op));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBinaryOp *node = getType<ExprBinaryOp>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBinaryOp(%s)", GetOpName(node->op));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(ExprGetAddress *node = getType<ExprGetAddress>(expression))
	{
		PrintIndented(ctx, name, node, "ExprGetAddress(%.*s: v%04x)", FMT_ISTR(node->variable->variable->name->name), node->variable->variable->uniqueId);
	}
	else if(ExprDereference *node = getType<ExprDereference>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprDereference()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprUnboxing *node = getType<ExprUnboxing>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprUnboxing()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprConditional *node = getType<ExprConditional>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprConditional()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprAssignment *node = getType<ExprAssignment>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprAssignment()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(ExprMemberAccess *node = getType<ExprMemberAccess>(expression))
	{
		if(node->member)
			PrintEnterBlock(ctx, name, node, "ExprMemberAccess(%.*s: v%04x)", FMT_ISTR(node->member->variable->name->name), node->member->variable->uniqueId);
		else
			PrintEnterBlock(ctx, name, node, "ExprMemberAccess(%%missing%%)");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArrayIndex *node = getType<ExprArrayIndex>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArrayIndex()");

		PrintGraph(ctx, node->value, "value");
		PrintGraph(ctx, node->index, "index");

		PrintLeaveBlock(ctx);
	}
	else if(ExprReturn *node = getType<ExprReturn>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprReturn()");

		PrintGraph(ctx, node->value, "value");

		PrintGraph(ctx, node->coroutineStateUpdate, "coroutineStateUpdate");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprYield *node = getType<ExprYield>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprYield()");

		PrintGraph(ctx, node->value, "value");

		PrintGraph(ctx, node->coroutineStateUpdate, "coroutineStateUpdate");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableDefinition *node = getType<ExprVariableDefinition>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprVariableDefinition(%.*s %.*s: v%04x)", FMT_ISTR(node->variable->variable->type->name), FMT_ISTR(node->variable->variable->name->name), node->variable->variable->uniqueId);

		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(ExprZeroInitialize *node = getType<ExprZeroInitialize>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprZeroInitialize()");

		PrintGraph(ctx, node->address, "address");

		PrintLeaveBlock(ctx);
	}
	else if(ExprArraySetup *node = getType<ExprArraySetup>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprArraySetup()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableDefinitions *node = getType<ExprVariableDefinitions>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprVariableDefinitions()");

		for(ExprBase *value = node->definitions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprVariableAccess(%.*s: v%04x)", FMT_ISTR(node->variable->name->name), node->variable->uniqueId);
	}
	else if(ExprFunctionContextAccess *node = getType<ExprFunctionContextAccess>(expression))
	{
		PrintIndented(ctx, name, node, "ExprFunctionContextAccess(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(expression))
	{
		if(ctx.skipFunctionDefinitions)
		{
			PrintIndented(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x);", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);
			return;
		}

		if(node->function->isPrototype)
		{
			PrintEnterBlock(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x)", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);
			
			if(FunctionData *implementation = node->function->implementation)
				PrintIndented(ctx, InplaceStr("implementation"), implementation->type, "%.*s: f%04x", FMT_ISTR(implementation->name->name), implementation->uniqueId);

			PrintLeaveBlock(ctx);

			return;
		}

		ctx.skipFunctionDefinitions = true;

		PrintEnterBlock(ctx, name, node, "ExprFunctionDefinition(%s%.*s: f%04x)", node->function->isPrototype ? "prototype, " : "", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintGraph(ctx, node->contextArgument, "contextArgument");

		PrintEnterBlock(ctx, InplaceStr("arguments"), 0);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->coroutineStateRead, "coroutineStateRead");

		PrintEnterBlock(ctx, InplaceStr("expressions"), 0);

		for(ExprBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);

		ctx.skipFunctionDefinitions = false;
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprGenericFunctionPrototype(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintEnterBlock(ctx, InplaceStr("contextVariables"), 0);

		for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionAccess(%.*s: f%04x)", FMT_ISTR(node->function->name->name), node->function->uniqueId);

		PrintGraph(ctx, node->context, "context");

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionOverloadSet()");

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(FunctionHandle *arg = node->functions.head; arg; arg = arg->next)
			PrintIndented(ctx, name, arg->function->type, "%.*s: f%04x", FMT_ISTR(arg->function->name->name), arg->function->uniqueId);

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->context, "context");

		PrintLeaveBlock(ctx);
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprShortFunctionOverloadSet()");

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(ShortFunctionHandle *arg = node->functions.head; arg; arg = arg->next)
		{
			PrintIndented(ctx, name, arg->function->type, "%.*s: f%04x", FMT_ISTR(arg->function->name->name), arg->function->uniqueId);

			PrintGraph(ctx, arg->context, "context");
		}

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFunctionCall()");

		PrintGraph(ctx, node->function, "function");

		PrintEnterBlock(ctx, InplaceStr("arguments"), 0);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprAliasDefinition *node = getType<ExprAliasDefinition>(expression))
	{
		PrintIndented(ctx, name, node, "ExprAliasDefinition(%.*s %.*s: a%04x)", FMT_ISTR(node->alias->type->name), FMT_ISTR(node->alias->name->name), node->alias->uniqueId);
	}
	else if(ExprClassPrototype *node = getType<ExprClassPrototype>(expression))
	{
		PrintIndented(ctx, name, node, "ExprClassPrototype(%.*s)", FMT_ISTR(node->classType->name));
	}
	else if(ExprGenericClassPrototype *node = getType<ExprGenericClassPrototype>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprGenericClassPrototype(%.*s)", FMT_ISTR(node->genericProtoType->name));

		PrintEnterBlock(ctx, InplaceStr("instances"), 0);

		for(ExprBase *value = node->genericProtoType->instances.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprClassDefinition *node = getType<ExprClassDefinition>(expression))
	{
		if(node->classType->baseClass)
			PrintEnterBlock(ctx, name, node, "ExprClassDefinition(%.*s: %.*s)", FMT_ISTR(node->classType->name), FMT_ISTR(node->classType->baseClass->name));
		else
			PrintEnterBlock(ctx, name, node, "ExprClassDefinition(%.*s%s)", FMT_ISTR(node->classType->name), node->classType->extendable ? " extendable" : "");

		PrintEnterBlock(ctx, InplaceStr("variables"), 0);

		for(MemberHandle *value = node->classType->members.head; value; value = value->next)
			PrintIndented(ctx, InplaceStr(), value->variable->type, "%.*s: v%04x @ 0x%x", FMT_ISTR(value->variable->name->name), value->variable->uniqueId, value->variable->offset);

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("functions"), 0);

		for(ExprBase *value = node->functions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("constants"), 0);

		for(ConstantData *value = node->classType->constants.head; value; value = value->next)
			PrintGraph(ctx, value->value, value->name->name);

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(ExprEnumDefinition *node = getType<ExprEnumDefinition>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprEnumDefinition(%.*s)", FMT_ISTR(node->enumType->name));

		PrintEnterBlock(ctx, InplaceStr("constants"), 0);

		for(ConstantData *value = node->enumType->constants.head; value; value = value->next)
			PrintGraph(ctx, value->value, value->name->name);

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->toInt, "toInt");
		PrintGraph(ctx, node->toEnum, "toEnum");

		PrintLeaveBlock(ctx);
	}
	else if(ExprIfElse *node = getType<ExprIfElse>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprIfElse()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprFor *node = getType<ExprFor>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprFor()");

		PrintGraph(ctx, node->initializer, "initializer");
		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->increment, "increment");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(ExprWhile *node = getType<ExprWhile>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprWhile()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(ExprDoWhile *node = getType<ExprDoWhile>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprDoWhile()");

		PrintGraph(ctx, node->body, "body");
		PrintGraph(ctx, node->condition, "condition");

		PrintLeaveBlock(ctx);
	}
	else if(ExprSwitch *node = getType<ExprSwitch>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprSwitch()");

		PrintGraph(ctx, node->condition, "condition");

		PrintEnterBlock(ctx, InplaceStr("cases"), 0);

		for(ExprBase *value = node->cases.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("blocks"), 0);

		for(ExprBase *value = node->blocks.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->defaultBlock, "defaultBlock");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBreak *node = getType<ExprBreak>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBreak(%d)", node->depth);

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprContinue *node = getType<ExprContinue>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprContinue(%d)", node->depth);

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprBlock *node = getType<ExprBlock>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprBlock()");

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintGraph(ctx, node->closures, "closures");

		PrintLeaveBlock(ctx);
	}
	else if(ExprSequence *node = getType<ExprSequence>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprSequence()");

		for(unsigned i = 0; i < node->expressions.size(); i++)
			PrintGraph(ctx, node->expressions[i], "");

		PrintLeaveBlock(ctx);
	}
	else if(ExprModule *node = getType<ExprModule>(expression))
	{
		PrintEnterBlock(ctx, name, node, "ExprModule()");

		if(!ctx.skipImported)
			PrintGraph(ctx, node->moduleScope, true);

		PrintGraph(ctx, node->moduleScope, false);

		PrintEnterBlock(ctx, InplaceStr("definitions"), 0);

		for(unsigned i = 0; i < node->definitions.size(); i++)
			PrintGraph(ctx, node->definitions[i], "");

		PrintLeaveBlock(ctx);

		ctx.skipFunctionDefinitions = true;

		PrintEnterBlock(ctx, InplaceStr("setup"), 0);

		for(ExprBase *value = node->setup.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, InplaceStr("expressions"), 0);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(!expression)
	{
		PrintIndent(ctx);

		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": null\n");
	}
	else
	{
		assert(!"unknown type");
	}
}